

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O2

void __thiscall
TEST_TestFailure_BinaryEqualTwoBytes_Test::testBody(TEST_TestFailure_BinaryEqualTwoBytes_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  uchar actualData [2];
  uchar expectedData [2];
  undefined1 local_98 [16];
  BinaryEqualFailure f;
  
  expectedData[0] = '\0';
  expectedData[1] = '\x01';
  actualData[0] = '\0';
  actualData[1] = '\x02';
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)local_98,"");
  BinaryEqualFailure::BinaryEqualFailure
            (&f,pUVar1,"fail.cpp",2,expectedData,actualData,2,(SimpleString *)local_98);
  SimpleString::~SimpleString((SimpleString *)local_98);
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_98);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_98);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "expected <00 01>\n\tbut was  <00 02>\n\tdifference starts at position 1 at: <      00 02         >\n\t                                               ^"
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x155,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_98);
  TestFailure::~TestFailure(&f.super_TestFailure);
  return;
}

Assistant:

TEST(TestFailure, BinaryEqualTwoBytes)
{
    const unsigned char expectedData[] = {0x00, 0x01};
    const unsigned char actualData[] = {0x00, 0x02};
    BinaryEqualFailure f(test, failFileName, failLineNumber, expectedData, actualData, sizeof(expectedData), "");
    FAILURE_EQUAL("expected <00 01>\n"
                "\tbut was  <00 02>\n"
    			"\tdifference starts at position 1 at: <      00 02         >\n"
    			"\t                                               ^", f);
}